

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ADE_DEP_DPFSP.cpp
# Opt level: O1

InfoInserzione __thiscall
ADE_DEP_DPFSP::miglioreInserzione
          (ADE_DEP_DPFSP *this,unsigned_short *vettoreFabbrica,
          unsigned_short dimensioneVettoreFabbrica,unsigned_short lavoroDaInserire)

{
  long lVar1;
  ushort uVar2;
  ushort uVar3;
  uint **ppuVar4;
  ulong uVar5;
  uint *puVar6;
  void *pvVar7;
  void *pvVar8;
  undefined6 in_register_00000012;
  long lVar9;
  unsigned_short i;
  ulong uVar10;
  uint uVar11;
  uint *puVar12;
  uint uVar13;
  ulong uVar14;
  short sVar15;
  int iVar16;
  ulong uVar17;
  bool bVar18;
  unsigned_short fabbrica [1];
  uint local_70;
  uint local_68;
  unsigned_short local_52;
  ulong local_50;
  ADE_DEP_DPFSP *local_48;
  uint *local_40;
  ulong local_38;
  
  if ((int)CONCAT62(in_register_00000012,dimensioneVettoreFabbrica) == 0) {
    local_52 = lavoroDaInserire;
    local_68 = valutaIndividuoParziale(this,&local_52,1);
    uVar10 = 0;
  }
  else {
    uVar2 = (this->istanza).macchine;
    uVar14 = (ulong)uVar2 << 2;
    local_40 = (uint *)operator_new__(uVar14);
    puVar6 = (uint *)operator_new__(uVar14);
    pvVar7 = operator_new__((ulong)(this->istanza).lavori << 3);
    uVar17 = (ulong)(dimensioneVettoreFabbrica - 1);
    uVar3 = (this->istanza).macchine;
    ppuVar4 = (this->istanza).p;
    uVar10 = uVar17;
    local_50 = (ulong)uVar2;
    local_48 = this;
    local_38 = (ulong)dimensioneVettoreFabbrica;
    do {
      pvVar8 = operator_new__(uVar14);
      uVar5 = local_38;
      *(void **)((long)pvVar7 + uVar10 * 8) = pvVar8;
      if (local_50 != 0) {
        lVar9 = (ulong)uVar2 + 1;
        do {
          lVar1 = lVar9 - (ulong)uVar3;
          if ((uVar10 == uVar17) || (lVar1 == 1)) {
            if ((uVar10 == uVar17) && (lVar1 != 1)) {
              uVar11 = ppuVar4[vettoreFabbrica[uVar10]][lVar9 + -2] +
                       *(int *)((long)pvVar8 + lVar9 * 4 + -4);
            }
            else {
              if (lVar1 == 1 && uVar10 != uVar17) {
                puVar12 = *(uint **)((long)pvVar7 + uVar10 * 8 + 8);
                uVar11 = ppuVar4[vettoreFabbrica[uVar10]][lVar9 + -2];
                goto LAB_001052d5;
              }
              uVar11 = ppuVar4[vettoreFabbrica[uVar10]][lVar9 + -2];
            }
          }
          else {
            uVar13 = *(uint *)((long)pvVar8 + lVar9 * 4 + -4);
            uVar11 = *(uint *)(*(long *)((long)pvVar7 + uVar10 * 8 + 8) + -8 + lVar9 * 4);
            if (uVar11 < uVar13) {
              uVar11 = uVar13;
            }
            puVar12 = ppuVar4[vettoreFabbrica[uVar10]];
LAB_001052d5:
            uVar11 = uVar11 + puVar12[lVar9 + -2];
          }
          *(uint *)((long)pvVar8 + lVar9 * 4 + -8) = uVar11;
          lVar9 = lVar9 + -1;
        } while (1 < lVar9);
      }
      bVar18 = 0 < (long)uVar10;
      uVar10 = uVar10 - 1;
    } while (bVar18);
    ppuVar4 = (local_48->istanza).p;
    local_68 = 0xffffffff;
    uVar10 = 0;
    local_70 = 0;
    do {
      uVar11 = 0;
      if (local_50 != 0) {
        uVar14 = 0;
        sVar15 = 0;
        do {
          if (sVar15 == 0 && (short)uVar10 == 0) {
            *puVar6 = *ppuVar4[lavoroDaInserire];
            uVar11 = *ppuVar4[*vettoreFabbrica];
LAB_00105403:
            *local_40 = uVar11;
          }
          else if (uVar14 == 0 && uVar10 != 0) {
            uVar11 = *local_40;
            *puVar6 = *ppuVar4[lavoroDaInserire] + uVar11;
            if (uVar10 != local_38) {
              uVar11 = uVar11 + *ppuVar4[vettoreFabbrica[uVar10]];
              goto LAB_00105403;
            }
          }
          else {
            if (uVar14 == 0 || uVar10 != 0) {
              uVar11 = *(uint *)((long)puVar6 + (uVar14 - 4));
              uVar13 = *(uint *)((long)local_40 + uVar14);
              if (uVar11 <= uVar13) {
                uVar11 = uVar13;
              }
              *(uint *)((long)puVar6 + uVar14) =
                   uVar11 + *(int *)((long)ppuVar4[lavoroDaInserire] + uVar14);
              if (uVar10 == local_38) goto LAB_0010548c;
              uVar17 = uVar14 - 4;
              if (*(uint *)((long)local_40 + (uVar14 - 4)) < uVar13) {
                uVar17 = uVar14;
              }
              iVar16 = *(int *)((long)ppuVar4[vettoreFabbrica[uVar10]] + uVar14) +
                       *(int *)((long)local_40 + uVar17);
            }
            else {
              *(int *)((long)puVar6 + uVar14) =
                   *(int *)((long)ppuVar4[lavoroDaInserire] + uVar14) +
                   *(int *)((long)puVar6 + (uVar14 - 4));
              iVar16 = *(int *)((long)ppuVar4[*vettoreFabbrica] + uVar14) +
                       *(int *)((long)local_40 + (uVar14 - 4));
            }
            *(int *)((long)local_40 + uVar14) = iVar16;
          }
LAB_0010548c:
          sVar15 = sVar15 + 1;
          uVar14 = uVar14 + 4;
        } while ((uint)((int)local_50 * 4) != uVar14);
        uVar11 = 0;
        if (local_50 != 0) {
          uVar14 = 0;
          uVar11 = 0;
          do {
            uVar13 = puVar6[uVar14];
            if (uVar10 != local_38) {
              uVar13 = uVar13 + *(int *)(*(long *)((long)pvVar7 + uVar10 * 8) + uVar14 * 4);
            }
            if (uVar13 < uVar11) {
              uVar13 = uVar11;
            }
            uVar11 = uVar13;
            uVar14 = uVar14 + 1;
          } while (local_50 != uVar14);
        }
      }
      bVar18 = uVar11 < local_68;
      if (bVar18) {
        local_68 = uVar11;
      }
      uVar11 = (uint)uVar10;
      if (!bVar18) {
        uVar11 = local_70;
      }
      uVar10 = uVar10 + 1;
      local_70 = uVar11;
    } while (uVar10 != ((int)local_38 + 1 + (uint)((short)local_38 == -1) & 0xffff));
    operator_delete__(local_40);
    operator_delete__(puVar6);
    uVar10 = 0;
    do {
      pvVar8 = *(void **)((long)pvVar7 + uVar10 * 8);
      if (pvVar8 != (void *)0x0) {
        operator_delete__(pvVar8);
      }
      uVar10 = uVar10 + 1;
    } while (uVar5 != uVar10);
    operator_delete__(pvVar7);
    uVar10 = ((ulong)uVar11 & 0xffff) << 0x20;
  }
  return (InfoInserzione)(local_68 | uVar10);
}

Assistant:

ADE_DEP_DPFSP::InfoInserzione ADE_DEP_DPFSP::miglioreInserzione(unsigned short* vettoreFabbrica, 
	unsigned short dimensioneVettoreFabbrica,
	unsigned short lavoroDaInserire) {

	if (dimensioneVettoreFabbrica == 0) {
		unsigned short fabbrica[1] = { lavoroDaInserire };
		return { valutaIndividuoParziale(fabbrica, 1) , 0};
	}
		
	//Accelerazione di Taillard, guardare l'articolo relativo
	unsigned int* e = new unsigned int[istanza.macchine];
	unsigned int* f = new unsigned int[istanza.macchine];
	unsigned int** q = new unsigned int* [istanza.lavori];

	unsigned int miglioreMakespan = UINT32_MAX;
	unsigned short migliorePosizione = 0;

	for (int i = dimensioneVettoreFabbrica - 1; i >= 0; i--) {
		q[i] = new unsigned int[istanza.macchine];

		for (int j = istanza.macchine - 1; j >= 0; j--) {

			if (i != dimensioneVettoreFabbrica - 1 && j != istanza.macchine - 1) {
				q[i][j] = max(q[i][j + 1], q[i + 1][j]) + istanza.p[vettoreFabbrica[i]][j];
			}
			else if (i == dimensioneVettoreFabbrica - 1 && j != istanza.macchine - 1) {
				q[i][j] = q[i][j + 1] + istanza.p[vettoreFabbrica[i]][j];
			}
			else if (i != dimensioneVettoreFabbrica - 1 && j == istanza.macchine - 1) {
				q[i][j] = q[i + 1][j] + istanza.p[vettoreFabbrica[i]][j];
			}
			else {
				q[i][j] = istanza.p[vettoreFabbrica[i]][j];
			}	
		}
	}

	for (unsigned short i = 0; i <= dimensioneVettoreFabbrica; i++) {

		for (unsigned short j = 0; j < istanza.macchine; j++) {

			if (i == 0 && j == 0) {
				f[0] = istanza.p[lavoroDaInserire][0];
				e[0] = istanza.p[vettoreFabbrica[0]][0];
			}
			else if (i != 0 && j == 0) {
				f[0] = e[0] + istanza.p[lavoroDaInserire][0];

				if (i != dimensioneVettoreFabbrica)
					e[0] = e[0] + istanza.p[vettoreFabbrica[i]][0];
			}
			else if (i == 0 && j != 0) {
				f[j] = f[j - 1] + istanza.p[lavoroDaInserire][j];
				e[j] = e[j - 1] + istanza.p[vettoreFabbrica[0]][j];
			}
			else {
				f[j] = max(f[j - 1], e[j]) + istanza.p[lavoroDaInserire][j];
				if (i != dimensioneVettoreFabbrica)
					e[j] = max(e[j - 1], e[j]) + istanza.p[vettoreFabbrica[i]][j];
			}
		}

		unsigned int makeSpanParziale = 0;

		for (unsigned short j = 0; j < istanza.macchine; j++) {

			if (i != dimensioneVettoreFabbrica)
				makeSpanParziale = max(makeSpanParziale, f[j] + q[i][j]);
			else
				makeSpanParziale = max(makeSpanParziale, f[j]);
		}

		if (makeSpanParziale < miglioreMakespan) {
			miglioreMakespan = makeSpanParziale;
			migliorePosizione = i;
		}

	}

	delete[] e;
	delete[] f;

	for (unsigned short i = 0; i < dimensioneVettoreFabbrica; i++) {
		delete[] q[i];
	}

	delete[] q;

	return { miglioreMakespan, migliorePosizione };
}